

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InstancedExpansionShader::shadePrimitives
          (InstancedExpansionShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  PrimitivePacket *pPVar1;
  int i;
  long lVar2;
  ulong uVar3;
  Vec4 centerPosition;
  Vec4 basePosition;
  Vec4 local_98;
  float local_84 [5];
  float local_70;
  float local_6c;
  float local_68 [6];
  InstancedExpansionShader *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (0 < numPackets) {
    local_84[4] = (float)invocationID;
    uVar3 = 0;
    local_50 = this;
    do {
      local_48 = *(undefined8 *)(packets[uVar3].vertices[0]->position).m_data;
      uStack_40 = *(undefined8 *)((packets[uVar3].vertices[0]->position).m_data + 2);
      pPVar1 = packets + uVar3;
      local_70 = (local_84[4] / (float)*(int *)&(local_50->super_ShaderProgram).field_0x154) * 6.3;
      local_6c = cosf(local_70);
      local_84[1] = sinf(local_70);
      local_84[0] = local_6c;
      local_84[2] = 0.0;
      local_84[3] = 0.0;
      local_98.m_data[0] = 0.0;
      local_98.m_data[1] = 0.0;
      local_98.m_data[2] = 0.0;
      local_98.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        local_98.m_data[lVar2] = local_84[lVar2] * 0.1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      local_68[3] = 0.0;
      lVar2 = 0;
      do {
        local_68[lVar2] = *(float *)((long)&local_48 + lVar2 * 4) + local_98.m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      local_84[0] = 0.0;
      local_84[1] = -0.1;
      local_84[2] = 0.0;
      local_84[3] = 0.0;
      local_98.m_data[0] = 0.0;
      local_98.m_data[1] = 0.0;
      local_98.m_data[2] = 0.0;
      local_98.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        local_98.m_data[lVar2] = local_68[lVar2] + local_84[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      rr::GeometryEmitter::EmitVertex(output,&local_98,0.0,(GenericVec4 *)0x0,pPVar1->primitiveIDIn)
      ;
      local_84[0] = -0.05;
      local_84[1] = 0.0;
      local_84[2] = 0.0;
      local_84[3] = 0.0;
      local_98.m_data[0] = 0.0;
      local_98.m_data[1] = 0.0;
      local_98.m_data[2] = 0.0;
      local_98.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        local_98.m_data[lVar2] = local_68[lVar2] + local_84[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      rr::GeometryEmitter::EmitVertex(output,&local_98,0.0,(GenericVec4 *)0x0,pPVar1->primitiveIDIn)
      ;
      local_84[0] = 0.05;
      local_84[1] = 0.0;
      local_84[2] = 0.0;
      local_84[3] = 0.0;
      local_98.m_data[0] = 0.0;
      local_98.m_data[1] = 0.0;
      local_98.m_data[2] = 0.0;
      local_98.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        local_98.m_data[lVar2] = local_68[lVar2] + local_84[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      rr::GeometryEmitter::EmitVertex(output,&local_98,0.0,(GenericVec4 *)0x0,pPVar1->primitiveIDIn)
      ;
      rr::GeometryEmitter::EndPrimitive(output);
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)numPackets);
  }
  return;
}

Assistant:

void InstancedExpansionShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex			= packets[packetNdx].vertices[0];
		const tcu::Vec4			basePosition	= vertex->position;
		const float				phase			= float(invocationID) / float(m_numInvocations) * 6.3f;
		const tcu::Vec4			centerPosition	= basePosition + tcu::Vec4(deFloatCos(phase), deFloatSin(phase), 0.0f, 0.0f) * 0.1f;

		output.EmitVertex(centerPosition + tcu::Vec4( 0.0f,  -0.1f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EmitVertex(centerPosition + tcu::Vec4(-0.05f,  0.0f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EmitVertex(centerPosition + tcu::Vec4( 0.05f,  0.0f, 0.0f, 0.0f), 0.0f, DE_NULL, packets[packetNdx].primitiveIDIn);
		output.EndPrimitive();
	}
}